

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Responses.cpp
# Opt level: O1

Response __thiscall
Response::status(Response *this,
                unordered_map<unsigned_long,_TaskSpec,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_TaskSpec>_>_>
                *tasks)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  value_t vVar2;
  json_value jVar3;
  reference pvVar4;
  pointer *ppbVar5;
  json_value extraout_RDX;
  _Hash_node_base *p_Var6;
  Response RVar7;
  json task_json;
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  tasks_json;
  string local_f8;
  value_t local_d8;
  json_value local_d0;
  value_t local_c8;
  json_value local_c0;
  value_t local_b8;
  json_value local_b0;
  value_t local_a8;
  json_value local_a0;
  value_t local_98;
  json_value local_90;
  value_t local_88;
  json_value local_80;
  value_t local_78;
  json_value local_70;
  value_t local_68;
  json_value local_60;
  undefined1 local_58 [8];
  json_value local_50;
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  local_48;
  
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"status","");
  Response(this,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_f8.field_2._M_allocated_capacity._4_2_,
                                      local_f8.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  local_48.
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = (tasks->_M_h)._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_58[0] = null;
      local_50.object = (object_t *)0x0;
      local_80 = *(json_value *)(p_Var6 + 2);
      local_88 = number_unsigned;
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_58,"id");
      vVar2 = pvVar4->m_type;
      pvVar4->m_type = local_88;
      jVar3 = pvVar4->m_value;
      pvVar4->m_value = local_80;
      local_88 = vVar2;
      local_80 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_80.boolean,vVar2);
      bin_str_to_hex(&local_f8,(string *)(p_Var6 + 3));
      local_c0.object = (object_t *)0x0;
      local_c8 = string;
      local_c0.object = (object_t *)operator_new(0x20);
      ppbVar5 = &((local_c0.array)->
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage;
      ((local_c0.array)->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar5;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p == paVar1) {
        *ppbVar5 = (pointer)CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                                     CONCAT24(local_f8.field_2._M_allocated_capacity._4_2_,
                                              local_f8.field_2._M_allocated_capacity._0_4_));
        local_c0.array[1].
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8.field_2._8_8_;
      }
      else {
        ((local_c0.array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._M_dataplus._M_p;
        ((local_c0.array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_f8.field_2._M_allocated_capacity._4_2_,
                                        local_f8.field_2._M_allocated_capacity._0_4_));
      }
      ((local_c0.array)->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._M_string_length;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity._0_4_ =
           local_f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_58,"connection_id");
      vVar2 = pvVar4->m_type;
      pvVar4->m_type = local_c8;
      jVar3 = pvVar4->m_value;
      (pvVar4->m_value).array = (array_t *)local_c0;
      local_c8 = vVar2;
      local_c0 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_c0.boolean,vVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,
                        CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_f8.field_2._M_allocated_capacity._4_2_,
                                          local_f8.field_2._M_allocated_capacity._0_4_)) + 1);
      }
      local_d0.object = (object_t *)0x0;
      local_d8 = string;
      local_d0.object =
           (object_t *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::create<std::__cxx11::string,std::__cxx11::string_const&>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var6 + 7));
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_58,"request");
      vVar2 = pvVar4->m_type;
      pvVar4->m_type = local_d8;
      jVar3 = pvVar4->m_value;
      (pvVar4->m_value).object = (object_t *)local_d0;
      local_d8 = vVar2;
      local_d0 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_d0.boolean,vVar2);
      local_90 = *(json_value *)(p_Var6 + 0xd);
      local_98 = number_unsigned;
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_58,"work_done");
      vVar2 = pvVar4->m_type;
      pvVar4->m_type = local_98;
      jVar3 = pvVar4->m_value;
      pvVar4->m_value = local_90;
      local_98 = vVar2;
      local_90 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_90.boolean,vVar2);
      local_a0 = *(json_value *)(p_Var6 + 0xc);
      local_a8 = number_unsigned;
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_58,"work_estimated");
      vVar2 = pvVar4->m_type;
      pvVar4->m_type = local_a8;
      jVar3 = pvVar4->m_value;
      pvVar4->m_value = local_a0;
      local_a8 = vVar2;
      local_a0 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_a0.boolean,vVar2);
      local_b0 = *(json_value *)(p_Var6 + 0xb);
      local_b8 = number_unsigned;
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_58,"epoch_ms");
      vVar2 = pvVar4->m_type;
      pvVar4->m_type = local_b8;
      jVar3 = pvVar4->m_value;
      pvVar4->m_value = local_b0;
      local_b8 = vVar2;
      local_b0 = jVar3;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_b0.boolean,vVar2);
      std::
      vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      ::push_back(&local_48,(value_type *)local_58);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)(local_58 + 8),local_58[0]);
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  local_60.object = (object_t *)0x0;
  local_68 = array;
  local_60.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>const&>
                 (&local_48);
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)this,"result");
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar4,"tasks");
  vVar2 = pvVar4->m_type;
  pvVar4->m_type = local_68;
  jVar3 = pvVar4->m_value;
  (pvVar4->m_value).object = (object_t *)local_60;
  local_68 = vVar2;
  local_60 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_60.boolean,vVar2);
  local_f8.field_2._M_allocated_capacity._0_4_ = 0x2e352e31;
  local_f8.field_2._M_allocated_capacity._4_2_ = 0x32;
  local_f8._M_string_length = 5;
  local_70.object = (object_t *)0x0;
  local_78 = string;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_70.object = (object_t *)operator_new(0x20);
  ppbVar5 = &((local_70.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_70.array)->
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == paVar1) {
    *ppbVar5 = (pointer)CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_f8.field_2._M_allocated_capacity._4_2_,
                                          local_f8.field_2._M_allocated_capacity._0_4_));
    local_70.array[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8.field_2._8_8_;
  }
  else {
    ((local_70.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_f8._M_dataplus._M_p;
    ((local_70.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                           CONCAT24(local_f8.field_2._M_allocated_capacity._4_2_,
                                    local_f8.field_2._M_allocated_capacity._0_4_));
  }
  ((local_70.array)->
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_f8._M_string_length;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity._0_4_ =
       local_f8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)this,"result");
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar4,"ursadb_version");
  vVar2 = pvVar4->m_type;
  pvVar4->m_type = local_78;
  jVar3 = pvVar4->m_value;
  (pvVar4->m_value).array = (array_t *)local_70;
  local_78 = vVar2;
  local_70 = jVar3;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_70.boolean,vVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,
                    CONCAT26(local_f8.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_f8.field_2._M_allocated_capacity._4_2_,
                                      local_f8.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  std::
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::~vector(&local_48);
  RVar7.content.m_value.object = extraout_RDX.object;
  RVar7.content._0_8_ = this;
  return (Response)RVar7.content;
}

Assistant:

Response Response::status(const std::unordered_map<uint64_t, TaskSpec> &tasks) {
    Response r("status");
    std::vector<json> tasks_json;
    for (auto &[k, task] : tasks) {
        json task_json;
        task_json["id"] = task.id();
        task_json["connection_id"] = task.hex_conn_id();
        task_json["request"] = task.request_str();
        task_json["work_done"] = task.work_done();
        task_json["work_estimated"] = task.work_estimated();
        task_json["epoch_ms"] = task.epoch_ms();
        tasks_json.push_back(task_json);
    }
    r.content["result"]["tasks"] = tasks_json;
    r.content["result"]["ursadb_version"] = std::string(ursadb_version_string);

    return r;
}